

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep.c
# Opt level: O3

int splittingStep_PrintAllStats(ARKodeMem ark_mem,FILE *outfile,SUNOutputFormat fmt)

{
  void *pvVar1;
  undefined8 uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  char name_buf [29];
  char acStack_58 [40];
  
  pvVar1 = ark_mem->step_mem;
  if (pvVar1 == (void *)0x0) {
    iVar3 = -0x15;
    arkProcessError(ark_mem,-0x15,0x20,"splittingStep_PrintAllStats",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_splittingstep.c"
                    ,"Time step module memory is NULL.");
  }
  else {
    if (0 < *(int *)((long)pvVar1 + 0x18)) {
      uVar4 = 0;
      do {
        uVar5 = uVar4 + 1;
        snprintf(acStack_58,0x1d,"Partition %i evolves",uVar5 & 0xffffffff);
        uVar2 = *(undefined8 *)(*(long *)((long)pvVar1 + 0x10) + uVar4 * 8);
        if (fmt == SUN_OUTPUTFORMAT_TABLE) {
          fprintf((FILE *)outfile,"%-*s = %ld\n",0x1d,acStack_58,uVar2);
        }
        else {
          fputc(0x2c,(FILE *)outfile);
          fprintf((FILE *)outfile,"%s,%ld",acStack_58,uVar2);
        }
        uVar4 = uVar5;
      } while ((long)uVar5 < (long)*(int *)((long)pvVar1 + 0x18));
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int splittingStep_PrintAllStats(ARKodeMem ark_mem, FILE* outfile,
                                       SUNOutputFormat fmt)
{
  ARKodeSplittingStepMem step_mem = NULL;
  int retval = splittingStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  char name_buf[SUN_TABLE_WIDTH];
  for (int k = 0; k < step_mem->partitions; k++)
  {
    snprintf(name_buf, sizeof(name_buf), "Partition %i evolves", k + 1);
    sunfprintf_long(outfile, fmt, SUNFALSE, name_buf,
                    step_mem->n_stepper_evolves[k]);
  }

  return ARK_SUCCESS;
}